

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

CScript * script_tests::sign_multisig
                    (CScript *scriptPubKey,vector<CKey,_std::allocator<CKey>_> *keys,
                    CTransaction *transaction)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  bool bVar2;
  undefined1 uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  uint256 *in_RDX;
  CKey *in_RSI;
  CScript *in_RDI;
  long in_FS_OFFSET;
  CKey *key;
  vector<CKey,_std::allocator<CKey>_> *__range1;
  CScript *result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  const_iterator __end1;
  const_iterator __begin1;
  uint256 hash;
  SigVersion in_stack_00000180;
  PrecomputedTransactionData *in_stack_00000188;
  ulong in_stack_fffffffffffffe88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *this;
  lazy_ostream *prev;
  assertion_result *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea8;
  const_string *msg;
  undefined4 uVar4;
  uint nIn;
  uint in_stack_fffffffffffffec8;
  undefined4 uVar5;
  CScript *in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffef0;
  int32_t in_stack_fffffffffffffef4;
  undefined4 uVar6;
  const_string local_d0 [2];
  lazy_ostream local_b0 [2];
  assertion_result local_90;
  
  uVar4 = SUB84(in_RDI,0);
  nIn = (uint)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prev = (lazy_ostream *)0x0;
  this = (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)(in_stack_fffffffffffffe88 & 0xffffffff00000000);
  uVar5 = 0;
  SignatureHash<CTransaction>
            (in_stack_fffffffffffffed0,(CTransaction *)(ulong)in_stack_fffffffffffffec8,nIn,
             in_stack_fffffffffffffef4,(CAmount *)in_RDI,in_stack_00000180,in_stack_00000188);
  uVar6 = 0;
  CScript::CScript((CScript *)this);
  CScript::operator<<((CScript *)CONCAT44(nIn,uVar4),(opcodetype)((ulong)in_RDI >> 0x20));
  std::vector<CKey,_std::allocator<CKey>_>::begin((vector<CKey,_std::allocator<CKey>_> *)prev);
  std::vector<CKey,_std::allocator<CKey>_>::end((vector<CKey,_std::allocator<CKey>_> *)prev);
  while (bVar2 = __gnu_cxx::operator==<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>
                           ((__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>
                             *)in_stack_fffffffffffffe98,
                            (__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>
                             *)prev), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>::operator*
              ((__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *)this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
    do {
      msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,(pointer)prev,
                 (unsigned_long)this);
      boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT44(uVar5,in_stack_fffffffffffffec8),
                 (const_string *)CONCAT44(nIn,uVar4),(size_t)in_RDI,msg);
      uVar3 = CKey::Sign(in_RSI,in_RDX,in_RCX,SUB41((uint)uVar6 >> 0x18,0),in_stack_fffffffffffffef0
                        );
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffe98,SUB81((ulong)prev >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,(pointer)prev,
                 (unsigned_long)this);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)this);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe98,(pointer)prev,
                 (unsigned_long)this);
      this = (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
              *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_90,local_b0,local_d0,0x3fe,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(this);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)this);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (value_type_conflict3 *)0xa54258);
    std::span<const_unsigned_char,_18446744073709551615UL>::
    span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
              ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffe98,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)prev);
    b._M_ptr._4_4_ = nIn;
    b._M_ptr._0_4_ = uVar4;
    b._M_extent._M_extent_value._0_4_ = in_stack_fffffffffffffec8;
    b._M_extent._M_extent_value._4_4_ = uVar5;
    CScript::operator<<((CScript *)CONCAT17(uVar3,in_stack_fffffffffffffea8),b);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe98);
    __gnu_cxx::__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>::
    operator++((__normal_iterator<const_CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static CScript
sign_multisig(const CScript& scriptPubKey, const std::vector<CKey>& keys, const CTransaction& transaction)
{
    uint256 hash = SignatureHash(scriptPubKey, transaction, 0, SIGHASH_ALL, 0, SigVersion::BASE);

    CScript result;
    //
    // NOTE: CHECKMULTISIG has an unfortunate bug; it requires
    // one extra item on the stack, before the signatures.
    // Putting OP_0 on the stack is the workaround;
    // fixing the bug would mean splitting the block chain (old
    // clients would not accept new CHECKMULTISIG transactions,
    // and vice-versa)
    //
    result << OP_0;
    for (const CKey &key : keys)
    {
        std::vector<unsigned char> vchSig;
        BOOST_CHECK(key.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        result << vchSig;
    }
    return result;
}